

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O0

NumberParseMatcher * __thiscall
icu_63::numparse::impl::CodePointMatcherWarehouse::nextCodePointMatcher
          (CodePointMatcherWarehouse *this,UChar32 cp)

{
  int iVar1;
  CodePointMatcher *pCVar2;
  int32_t iVar3;
  reference this_00;
  undefined8 *puVar4;
  CodePointMatcher **ppCVar5;
  undefined4 in_register_00000034;
  CodePointMatcher *local_a8;
  CodePointMatcher *local_98;
  CodePointMatcher local_78;
  undefined1 local_61;
  CodePointMatcher *local_60;
  CodePointMatcher *local_58;
  undefined1 local_49;
  undefined8 *local_48;
  CodePointMatcher *local_40;
  CodePointMatcher *nextBatch;
  undefined1 local_30 [4];
  int32_t totalCapacity;
  UChar32 local_1c;
  CodePointMatcherWarehouse *pCStack_18;
  UChar32 cp_local;
  CodePointMatcherWarehouse *this_local;
  
  local_1c = cp;
  pCStack_18 = this;
  if (this->codePointCount < 5) {
    CodePointMatcher::CodePointMatcher((CodePointMatcher *)local_30,cp);
    iVar1 = this->codePointCount;
    this->codePointCount = iVar1 + 1;
    this_00 = std::array<icu_63::numparse::impl::CodePointMatcher,_5UL>::operator[]
                        (&this->codePoints,(long)iVar1);
    this_local = (CodePointMatcherWarehouse *)
                 CodePointMatcher::operator=(this_00,(CodePointMatcher *)local_30);
    CodePointMatcher::~CodePointMatcher((CodePointMatcher *)local_30);
  }
  else {
    nextBatch._4_4_ = this->codePointNumBatches * 10 + 5;
    if (nextBatch._4_4_ <= this->codePointCount) {
      puVar4 = (undefined8 *)
               UMemory::operator_new__((UMemory *)0xa8,CONCAT44(in_register_00000034,cp));
      local_49 = 0;
      local_61 = 0;
      local_98 = (CodePointMatcher *)0x0;
      if (puVar4 != (undefined8 *)0x0) {
        local_49 = 1;
        *puVar4 = 10;
        local_98 = (CodePointMatcher *)(puVar4 + 1);
        local_a8 = local_98;
        local_48 = puVar4;
        do {
          local_60 = local_a8;
          local_61 = 1;
          local_58 = local_98;
          CodePointMatcher::CodePointMatcher(local_a8);
          local_a8 = local_a8 + 1;
        } while (local_a8 != (CodePointMatcher *)(puVar4 + 0x15));
      }
      local_40 = local_98;
      iVar1 = this->codePointNumBatches;
      iVar3 = MaybeStackArray<icu_63::numparse::impl::CodePointMatcher_*,_3>::getCapacity
                        (&this->codePointsOverflow);
      if (iVar3 <= iVar1) {
        MaybeStackArray<icu_63::numparse::impl::CodePointMatcher_*,_3>::resize
                  (&this->codePointsOverflow,this->codePointNumBatches << 1,
                   this->codePointNumBatches);
      }
      pCVar2 = local_40;
      iVar1 = this->codePointNumBatches;
      this->codePointNumBatches = iVar1 + 1;
      ppCVar5 = MaybeStackArray<icu_63::numparse::impl::CodePointMatcher_*,_3>::operator[]
                          (&this->codePointsOverflow,(long)iVar1);
      *ppCVar5 = pCVar2;
    }
    CodePointMatcher::CodePointMatcher(&local_78,local_1c);
    ppCVar5 = MaybeStackArray<icu_63::numparse::impl::CodePointMatcher_*,_3>::operator[]
                        (&this->codePointsOverflow,(long)(this->codePointNumBatches + -1));
    pCVar2 = *ppCVar5;
    iVar1 = this->codePointCount;
    this->codePointCount = iVar1 + 1;
    this_local = (CodePointMatcherWarehouse *)
                 CodePointMatcher::operator=(pCVar2 + (iVar1 + -5) % 10,&local_78);
    CodePointMatcher::~CodePointMatcher(&local_78);
  }
  return (NumberParseMatcher *)this_local;
}

Assistant:

NumberParseMatcher& CodePointMatcherWarehouse::nextCodePointMatcher(UChar32 cp) {
    if (codePointCount < CODE_POINT_STACK_CAPACITY) {
        return codePoints[codePointCount++] = {cp};
    }
    int32_t totalCapacity = CODE_POINT_STACK_CAPACITY + codePointNumBatches * CODE_POINT_BATCH_SIZE;
    if (codePointCount >= totalCapacity) {
        // Need a new batch
        auto* nextBatch = new CodePointMatcher[CODE_POINT_BATCH_SIZE];
        if (codePointNumBatches >= codePointsOverflow.getCapacity()) {
            // Need more room for storing pointers to batches
            codePointsOverflow.resize(codePointNumBatches * 2, codePointNumBatches);
        }
        codePointsOverflow[codePointNumBatches++] = nextBatch;
    }
    return codePointsOverflow[codePointNumBatches - 1][(codePointCount++ - CODE_POINT_STACK_CAPACITY) %
                                                       CODE_POINT_BATCH_SIZE] = {cp};
}